

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.cpp
# Opt level: O0

Namer * __thiscall LiteScript::Namer::operator=(Namer *this,Namer *n)

{
  Namer *n_local;
  Namer *this_local;
  
  Nullable<LiteScript::Variable>::operator=(&this->current,&n->current);
  std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::clear(&this->heap);
  std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::operator=
            (&this->heap,&n->heap);
  return this;
}

Assistant:

LiteScript::Namer& LiteScript::Namer::operator=(const Namer &n) {
    this->current = n.current;
    this->heap.clear();
    this->heap = n.heap;
    return *this;
}